

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall hwnet::util::TimerMgr::up(TimerMgr *this,size_t idx)

{
  pointer ppTVar1;
  Timer *pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = idx >> 1;
  do {
    if (uVar5 == 0) {
      return;
    }
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = ppTVar1[idx - 1];
    uVar3 = pTVar2->mExpiredTime;
    uVar4 = ppTVar1[uVar5 - 1]->mExpiredTime;
    uVar6 = uVar5;
    if (uVar3 < uVar4) {
      if (idx != uVar5) {
        ppTVar1[idx - 1] = ppTVar1[uVar5 - 1];
        (this->elements).
        super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5 - 1] = pTVar2;
        ppTVar1 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar1[idx - 1]->mIndex = idx;
        ppTVar1[uVar5 - 1]->mIndex = uVar5;
      }
      uVar6 = uVar5 >> 1;
      idx = uVar5;
    }
    uVar5 = uVar6;
  } while (uVar3 < uVar4);
  return;
}

Assistant:

void up(size_t idx) {
		auto p = parent(idx);
		while(p > 0) {
			auto offsetIdx = getOffset(idx);
			auto offsetP = getOffset(p);
			if(this->elements[offsetIdx]->mExpiredTime < this->elements[offsetP]->mExpiredTime) {
				this->swap(idx,p);
				idx = p;
				p = parent(idx);
			} else {
				break;
			}
		}
	}